

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

void __thiscall
Assimp::FBX::FBXConverter::ConvertCluster
          (FBXConverter *this,vector<aiBone_*,_std::allocator<aiBone_*>_> *bones,Model *param_2,
          Cluster *cl,vector<unsigned_long,_std::allocator<unsigned_long>_> *out_indices,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *index_out_indices,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *count_out_indices,
          aiMatrix4x4 *node_global_transform)

{
  pointer *pppaVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  pointer puVar24;
  pointer puVar25;
  aiBone *paVar26;
  ulong uVar27;
  aiVertexWeight *__s;
  long lVar28;
  iterator __position;
  unsigned_long uVar29;
  ulong uVar30;
  unsigned_long uVar31;
  long lVar32;
  aiBone *bone;
  aiBone *local_98;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_58;
  string local_50;
  
  local_58 = index_out_indices;
  paVar26 = (aiBone *)operator_new(0x450);
  (paVar26->mName).length = 0;
  (paVar26->mName).data[0] = '\0';
  memset((paVar26->mName).data + 1,0x1b,0x3ff);
  paVar26->mNumWeights = 0;
  paVar26->mWeights = (aiVertexWeight *)0x0;
  (paVar26->mOffsetMatrix).a1 = 1.0;
  (paVar26->mOffsetMatrix).a2 = 0.0;
  (paVar26->mOffsetMatrix).a3 = 0.0;
  (paVar26->mOffsetMatrix).a4 = 0.0;
  (paVar26->mOffsetMatrix).b1 = 0.0;
  (paVar26->mOffsetMatrix).b2 = 1.0;
  (paVar26->mOffsetMatrix).b3 = 0.0;
  (paVar26->mOffsetMatrix).b4 = 0.0;
  (paVar26->mOffsetMatrix).c1 = 0.0;
  (paVar26->mOffsetMatrix).c2 = 0.0;
  (paVar26->mOffsetMatrix).c3 = 1.0;
  (paVar26->mOffsetMatrix).c4 = 0.0;
  (paVar26->mOffsetMatrix).d1 = 0.0;
  (paVar26->mOffsetMatrix).d2 = 0.0;
  (paVar26->mOffsetMatrix).d3 = 0.0;
  (paVar26->mOffsetMatrix).d4 = 1.0;
  __position._M_current =
       (bones->super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_98 = paVar26;
  if (__position._M_current ==
      (bones->super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiBone*,std::allocator<aiBone*>>::_M_realloc_insert<aiBone*const&>
              ((vector<aiBone*,std::allocator<aiBone*>> *)bones,__position,&local_98);
  }
  else {
    *__position._M_current = paVar26;
    pppaVar1 = &(bones->super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppaVar1 = *pppaVar1 + 1;
  }
  FixNodeName(&local_50,(FBXConverter *)__position._M_current,&(cl->node->super_Object).name);
  paVar26 = local_98;
  if (local_50._M_string_length < 0x400) {
    (local_98->mName).length = (ai_uint32)local_50._M_string_length;
    memcpy((local_98->mName).data,local_50._M_dataplus._M_p,local_50._M_string_length);
    (paVar26->mName).data[local_50._M_string_length] = '\0';
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  fVar13 = (cl->transformLink).a1;
  fVar14 = (cl->transformLink).a2;
  fVar15 = (cl->transformLink).a3;
  fVar16 = (cl->transformLink).a4;
  fVar9 = (cl->transformLink).b1;
  fVar10 = (cl->transformLink).b2;
  fVar11 = (cl->transformLink).b3;
  fVar12 = (cl->transformLink).b4;
  fVar5 = (cl->transformLink).c1;
  fVar6 = (cl->transformLink).c2;
  fVar7 = (cl->transformLink).c3;
  fVar8 = (cl->transformLink).c4;
  fVar2 = (cl->transformLink).d2;
  fVar3 = (cl->transformLink).d3;
  fVar4 = (cl->transformLink).d4;
  (local_98->mOffsetMatrix).d1 = (cl->transformLink).d1;
  (local_98->mOffsetMatrix).d2 = fVar2;
  (local_98->mOffsetMatrix).d3 = fVar3;
  (local_98->mOffsetMatrix).d4 = fVar4;
  (local_98->mOffsetMatrix).c1 = fVar5;
  (local_98->mOffsetMatrix).c2 = fVar6;
  (local_98->mOffsetMatrix).c3 = fVar7;
  (local_98->mOffsetMatrix).c4 = fVar8;
  (local_98->mOffsetMatrix).b1 = fVar9;
  (local_98->mOffsetMatrix).b2 = fVar10;
  (local_98->mOffsetMatrix).b3 = fVar11;
  (local_98->mOffsetMatrix).b4 = fVar12;
  (local_98->mOffsetMatrix).a1 = fVar13;
  (local_98->mOffsetMatrix).a2 = fVar14;
  (local_98->mOffsetMatrix).a3 = fVar15;
  (local_98->mOffsetMatrix).a4 = fVar16;
  aiMatrix4x4t<float>::Inverse(&local_98->mOffsetMatrix);
  paVar26 = local_98;
  fVar2 = (local_98->mOffsetMatrix).a1;
  fVar3 = (local_98->mOffsetMatrix).a2;
  fVar4 = (local_98->mOffsetMatrix).a3;
  fVar5 = (local_98->mOffsetMatrix).a4;
  local_80 = node_global_transform->b1;
  fVar6 = node_global_transform->a1;
  fVar7 = node_global_transform->a2;
  local_7c = node_global_transform->c1;
  fVar8 = node_global_transform->d1;
  local_5c = fVar8 * fVar5 + local_7c * fVar4 + fVar6 * fVar2 + fVar3 * local_80;
  fVar9 = node_global_transform->b2;
  fVar10 = node_global_transform->c2;
  local_88 = node_global_transform->d2;
  local_60 = local_88 * fVar5 + fVar10 * fVar4 + fVar7 * fVar2 + fVar3 * fVar9;
  fVar11 = node_global_transform->b3;
  fVar12 = node_global_transform->a3;
  local_8c = node_global_transform->c3;
  fVar13 = node_global_transform->d3;
  local_64 = fVar13 * fVar5 + local_8c * fVar4 + fVar12 * fVar2 + fVar3 * fVar11;
  local_90 = node_global_transform->b4;
  fVar14 = node_global_transform->a4;
  fVar15 = node_global_transform->c4;
  local_84 = node_global_transform->d4;
  local_68 = fVar5 * local_84 + fVar4 * fVar15 + fVar2 * fVar14 + fVar3 * local_90;
  fVar2 = (local_98->mOffsetMatrix).b2;
  fVar3 = (local_98->mOffsetMatrix).b1;
  fVar4 = (local_98->mOffsetMatrix).b3;
  fVar5 = (local_98->mOffsetMatrix).b4;
  local_6c = fVar8 * fVar5 + local_7c * fVar4 + fVar6 * fVar3 + fVar2 * local_80;
  local_70 = local_88 * fVar5 + fVar10 * fVar4 + fVar7 * fVar3 + fVar2 * fVar9;
  local_74 = fVar13 * fVar5 + local_8c * fVar4 + fVar12 * fVar3 + fVar2 * fVar11;
  fVar16 = (local_98->mOffsetMatrix).c2;
  fVar17 = (local_98->mOffsetMatrix).c1;
  fVar18 = (local_98->mOffsetMatrix).c3;
  fVar19 = (local_98->mOffsetMatrix).c4;
  local_78 = fVar8 * fVar19 + local_7c * fVar18 + fVar6 * fVar17 + fVar16 * local_80;
  fVar20 = (local_98->mOffsetMatrix).d2;
  fVar21 = (local_98->mOffsetMatrix).d1;
  fVar22 = (local_98->mOffsetMatrix).d3;
  fVar23 = (local_98->mOffsetMatrix).d4;
  (local_98->mOffsetMatrix).a1 = local_5c;
  (local_98->mOffsetMatrix).a2 = local_60;
  (local_98->mOffsetMatrix).a3 = local_64;
  (local_98->mOffsetMatrix).a4 = local_68;
  (local_98->mOffsetMatrix).b1 = local_6c;
  (local_98->mOffsetMatrix).b2 = local_70;
  (local_98->mOffsetMatrix).b3 = local_74;
  (local_98->mOffsetMatrix).b4 =
       fVar5 * local_84 + fVar4 * fVar15 + fVar3 * fVar14 + fVar2 * local_90;
  (local_98->mOffsetMatrix).c1 = local_78;
  (local_98->mOffsetMatrix).c2 =
       local_88 * fVar19 + fVar10 * fVar18 + fVar7 * fVar17 + fVar16 * fVar9;
  (local_98->mOffsetMatrix).c3 =
       fVar13 * fVar19 + local_8c * fVar18 + fVar12 * fVar17 + fVar16 * fVar11;
  (local_98->mOffsetMatrix).c4 =
       fVar19 * local_84 + fVar18 * fVar15 + fVar17 * fVar14 + fVar16 * local_90;
  (local_98->mOffsetMatrix).d1 =
       fVar8 * fVar23 + local_7c * fVar22 + fVar6 * fVar21 + local_80 * fVar20;
  (local_98->mOffsetMatrix).d2 =
       local_88 * fVar23 + fVar10 * fVar22 + fVar7 * fVar21 + fVar9 * fVar20;
  (local_98->mOffsetMatrix).d3 =
       fVar13 * fVar23 + local_8c * fVar22 + fVar12 * fVar21 + fVar11 * fVar20;
  (local_98->mOffsetMatrix).d4 =
       local_84 * fVar23 + fVar15 * fVar22 + fVar14 * fVar21 + fVar20 * local_90;
  local_98->mNumWeights =
       (uint)((ulong)((long)(out_indices->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(out_indices->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start) >> 3);
  puVar24 = (out_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
            .super__Vector_impl_data._M_start;
  puVar25 = (out_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
            .super__Vector_impl_data._M_finish;
  uVar27 = (long)puVar25 - (long)puVar24;
  uVar30 = 0xffffffffffffffff;
  if (-1 < (long)uVar27) {
    uVar30 = uVar27;
  }
  __s = (aiVertexWeight *)operator_new__(uVar30);
  lVar32 = (long)puVar25 - (long)puVar24;
  if (lVar32 != 0) {
    memset(__s,0,(lVar32 - 8U & 0xfffffffffffffff8) + 8);
  }
  paVar26->mWeights = __s;
  lVar32 = (long)(local_58->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(local_58->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
  if (lVar32 != 0) {
    lVar32 = lVar32 >> 3;
    lVar28 = 0;
    do {
      uVar29 = (local_58->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
               .super__Vector_impl_data._M_start[lVar28];
      if (uVar29 != 0xffffffffffffffff) {
        for (uVar31 = (count_out_indices->
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar28]; uVar31 != 0; uVar31 = uVar31 - 1) {
          __s->mVertexId =
               (uint)(out_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar29];
          __s->mWeight = (cl->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar28];
          __s = __s + 1;
          uVar29 = uVar29 + 1;
        }
      }
      lVar28 = lVar28 + 1;
    } while (lVar28 != lVar32 + (ulong)(lVar32 == 0));
  }
  return;
}

Assistant:

void FBXConverter::ConvertCluster(std::vector<aiBone*>& bones, const Model& /*model*/, const Cluster& cl,
            std::vector<size_t>& out_indices,
            std::vector<size_t>& index_out_indices,
            std::vector<size_t>& count_out_indices,
            const aiMatrix4x4& node_global_transform)
        {

            aiBone* const bone = new aiBone();
            bones.push_back(bone);

            bone->mName = FixNodeName(cl.TargetNode()->Name());

            bone->mOffsetMatrix = cl.TransformLink();
            bone->mOffsetMatrix.Inverse();

            bone->mOffsetMatrix = bone->mOffsetMatrix * node_global_transform;

            bone->mNumWeights = static_cast<unsigned int>(out_indices.size());
            aiVertexWeight* cursor = bone->mWeights = new aiVertexWeight[out_indices.size()];

            const size_t no_index_sentinel = std::numeric_limits<size_t>::max();
            const WeightArray& weights = cl.GetWeights();

            const size_t c = index_out_indices.size();
            for (size_t i = 0; i < c; ++i) {
                const size_t index_index = index_out_indices[i];

                if (index_index == no_index_sentinel) {
                    continue;
                }

                const size_t cc = count_out_indices[i];
                for (size_t j = 0; j < cc; ++j) {
                    aiVertexWeight& out_weight = *cursor++;

                    out_weight.mVertexId = static_cast<unsigned int>(out_indices[index_index + j]);
                    out_weight.mWeight = weights[i];
                }
            }
        }